

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkIndexType Diligent::TypeToVkIndexType(VALUE_TYPE IndexType)

{
  VkIndexType VVar1;
  int iVar2;
  undefined7 in_register_00000039;
  string msg;
  string local_28;
  
  iVar2 = (int)CONCAT71(in_register_00000039,IndexType);
  if (iVar2 == 0) {
    VVar1 = VK_INDEX_TYPE_NONE_KHR;
  }
  else {
    if (iVar2 != 6) {
      if (iVar2 == 5) {
        return VK_INDEX_TYPE_UINT16;
      }
      FormatString<char[22]>(&local_28,(char (*) [22])"Unexpected index type");
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"TypeToVkIndexType",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x291);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
    }
    VVar1 = VK_INDEX_TYPE_UINT32;
  }
  return VVar1;
}

Assistant:

VkIndexType TypeToVkIndexType(VALUE_TYPE IndexType)
{
    switch (IndexType)
    {
        // clang-format off
        case VT_UNDEFINED: return VK_INDEX_TYPE_NONE_KHR; // only for ray tracing
        case VT_UINT16:    return VK_INDEX_TYPE_UINT16;
        case VT_UINT32:    return VK_INDEX_TYPE_UINT32;
        // clang-format on
        default:
            UNEXPECTED("Unexpected index type");
            return VK_INDEX_TYPE_UINT32;
    }
}